

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall cmFileInstaller::HandleInstallDestination(cmFileInstaller *this)

{
  string *__rhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  char cVar3;
  cmCommand *pcVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  long *plVar8;
  undefined8 *puVar9;
  size_type *psVar10;
  bool bVar11;
  string sdestdir;
  string message;
  string local_70;
  string local_50;
  
  __rhs = &(this->super_cmFileCopier).Destination;
  if (((this->super_cmFileCopier).Destination._M_string_length < 2) &&
     (iVar5 = std::__cxx11::string::compare((char *)__rhs), iVar5 != 0)) {
    pcVar4 = &((this->super_cmFileCopier).FileCommand)->super_cmCommand;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "called with inappropriate arguments. No DESTINATION provided or .","");
    cmCommand::SetError(pcVar4,&local_70);
  }
  else {
    pcVar6 = cmsys::SystemTools::GetEnv("DESTDIR");
    if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
      paVar1 = &local_70.field_2;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      sVar7 = strlen(pcVar6);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar6,pcVar6 + sVar7);
      cmsys::SystemTools::ConvertToUnixSlashes(&local_70);
      pcVar6 = (this->super_cmFileCopier).Destination._M_dataplus._M_p;
      cVar2 = *pcVar6;
      bVar11 = true;
      if (2 < (this->super_cmFileCopier).Destination._M_string_length) {
        bVar11 = pcVar6[2] != '/';
      }
      cVar3 = pcVar6[1];
      if (cVar2 == '/') {
        if (cVar3 != '/') goto LAB_003c20db;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   "called with network path DESTINATION. This does not make sense when using DESTDIR. Specify local absolute path or remove DESTDIR environment variable.\nDESTINATION=\n"
                   ,"");
        std::__cxx11::string::_M_append
                  ((char *)&local_50,(ulong)(this->super_cmFileCopier).Destination._M_dataplus._M_p)
        ;
        cmCommand::SetError(&((this->super_cmFileCopier).FileCommand)->super_cmCommand,&local_50);
LAB_003c20b1:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p == paVar1) {
          return false;
        }
        goto LAB_003c22bf;
      }
      if ((byte)(cVar2 + 0x9fU) < 0x1a) {
        if (cVar3 != ':' || bVar11) {
LAB_003c207f:
          pcVar4 = &((this->super_cmFileCopier).FileCommand)->super_cmCommand;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,
                     "called with relative DESTINATION. This does not make sense when using DESTDIR. Specify absolute path or remove DESTDIR environment variable."
                     ,"");
          cmCommand::SetError(pcVar4,&local_50);
          goto LAB_003c20b1;
        }
      }
      else if ((cVar3 != ':' || bVar11) || (byte)(cVar2 + 0xa5U) < 0xe6) goto LAB_003c207f;
LAB_003c20db:
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_70._M_dataplus._M_p,
                 local_70._M_dataplus._M_p + local_70._M_string_length);
      std::__cxx11::string::append((char *)&local_50);
      std::__cxx11::string::operator=((string *)__rhs,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      this->DestDirLength = (int)local_70._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    if (*(int *)&(this->super_cmFileCopier).field_0xa4 == 6) {
      return true;
    }
    bVar11 = cmsys::SystemTools::FileExists((__rhs->_M_dataplus)._M_p);
    if ((bVar11) || (bVar11 = cmsys::SystemTools::MakeDirectory((__rhs->_M_dataplus)._M_p), bVar11))
    {
      bVar11 = cmsys::SystemTools::FileIsDirectory(__rhs);
      if (bVar11) {
        return true;
      }
      std::operator+(&local_50,"INSTALL destination: ",__rhs);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      psVar10 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_70.field_2._M_allocated_capacity = *psVar10;
        local_70.field_2._8_8_ = plVar8[3];
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar10;
        local_70._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_70._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      cmCommand::SetError(&((this->super_cmFileCopier).FileCommand)->super_cmCommand,&local_70);
    }
    else {
      std::operator+(&local_50,"cannot create directory: ",__rhs);
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      psVar10 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_70.field_2._M_allocated_capacity = *psVar10;
        local_70.field_2._8_8_ = puVar9[3];
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar10;
        local_70._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_70._M_string_length = puVar9[1];
      *puVar9 = psVar10;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      cmCommand::SetError(&((this->super_cmFileCopier).FileCommand)->super_cmCommand,&local_70);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == &local_70.field_2) {
    return false;
  }
LAB_003c22bf:
  operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  return false;
}

Assistant:

bool cmFileInstaller::HandleInstallDestination()
{
  std::string& destination = this->Destination;

  // allow for / to be a valid destination
  if ( destination.size() < 2 && destination != "/" )
    {
    this->FileCommand->SetError("called with inappropriate arguments. "
        "No DESTINATION provided or .");
    return false;
    }

  const char* destdir = cmSystemTools::GetEnv("DESTDIR");
  if ( destdir && *destdir )
    {
    std::string sdestdir = destdir;
    cmSystemTools::ConvertToUnixSlashes(sdestdir);
    char ch1 = destination[0];
    char ch2 = destination[1];
    char ch3 = 0;
    if ( destination.size() > 2 )
      {
      ch3 = destination[2];
      }
    int skip = 0;
    if ( ch1 != '/' )
      {
      int relative = 0;
      if (((ch1 >= 'a' && ch1 <= 'z') || (ch1 >= 'A' && ch1 <= 'Z')) &&
             ch2 == ':' )
        {
        // Assume windows
        // let's do some destdir magic:
        skip = 2;
        if ( ch3 != '/' )
          {
          relative = 1;
          }
        }
      else
        {
        relative = 1;
        }
      if ( relative )
        {
        // This is relative path on unix or windows. Since we are doing
        // destdir, this case does not make sense.
        this->FileCommand->SetError(
          "called with relative DESTINATION. This "
          "does not make sense when using DESTDIR. Specify "
          "absolute path or remove DESTDIR environment variable.");
        return false;
        }
      }
    else
      {
      if ( ch2 == '/' )
        {
        // looks like a network path.
        std::string message = "called with network path DESTINATION. This "
          "does not make sense when using DESTDIR. Specify local "
          "absolute path or remove DESTDIR environment variable."
          "\nDESTINATION=\n";
        message += destination;
        this->FileCommand->SetError(message);
        return false;
        }
      }
    destination = sdestdir + (destination.c_str() + skip);
    this->DestDirLength = int(sdestdir.size());
    }

  if(this->InstallType != cmInstallType_DIRECTORY)
    {
    if ( !cmSystemTools::FileExists(destination.c_str()) )
      {
      if ( !cmSystemTools::MakeDirectory(destination.c_str()) )
        {
        std::string errstring = "cannot create directory: " + destination +
          ". Maybe need administrative privileges.";
        this->FileCommand->SetError(errstring);
        return false;
        }
      }
    if ( !cmSystemTools::FileIsDirectory(destination) )
      {
      std::string errstring = "INSTALL destination: " + destination +
        " is not a directory.";
      this->FileCommand->SetError(errstring);
      return false;
      }
    }
  return true;
}